

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.h
# Opt level: O0

void cpsm::detail::
     for_each_match<cpsm::NonPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>
               (string_ref query,Options *opts,
               RangeSource<cpsm::StringRefItem,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *src,anon_class_1_0_00000001 *dst)

{
  string_ref item;
  basic_string_ref<char,_std::char_traits<char>_> args_1;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Error *this;
  string *psVar4;
  reference this_00;
  size_type sVar5;
  size_t sVar6;
  Matched<cpsm::StringRefItem> *pMVar7;
  reference pMVar8;
  undefined8 uVar9;
  undefined8 in_RCX;
  Options *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  string_ref item_00;
  Matched<cpsm::StringRefItem> *match_1;
  iterator __end0_2;
  iterator __begin0_2;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *__range3_1;
  Matched<cpsm::StringRefItem> *match;
  iterator __end0_1;
  iterator __begin0_1;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *__range3;
  Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> matcher;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *matches;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  *__range2;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  all_matches;
  value_type *thread;
  uint i_1;
  size_t nr_matches;
  uint i;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> threads;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  thread_matches;
  MatcherOptions mopts;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *in_stack_fffffffffffffc58;
  Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  Matched<cpsm::StringRefItem> *in_stack_fffffffffffffc70;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  in_stack_fffffffffffffc78;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  in_stack_fffffffffffffc80;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  in_stack_fffffffffffffc88;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  Matched<cpsm::StringRefItem> *pMVar10;
  size_t in_stack_fffffffffffffca0;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  local_318;
  Matched<cpsm::StringRefItem> *local_310;
  char *local_308;
  size_t sStack_300;
  undefined1 in_stack_fffffffffffffd08 [16];
  string_ref in_stack_fffffffffffffd18;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  local_2c8;
  Matched<cpsm::StringRefItem> *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  MatcherOptions *in_stack_fffffffffffffd68;
  Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *in_stack_fffffffffffffd70;
  string_ref in_stack_fffffffffffffd78;
  __normal_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_*,_std::vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>_>
  local_140;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  *local_138;
  Matched<cpsm::StringRefItem> local_130;
  undefined1 local_111;
  string local_110 [32];
  Thread *local_f0;
  uint local_e4;
  long local_e0;
  uint local_d8;
  Options *local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  char **local_b8;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  *local_b0;
  uint local_a4;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> local_a0 [2];
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  local_70;
  string_ref local_58;
  char *local_48;
  size_t sStack_40;
  undefined1 local_38;
  undefined8 local_20;
  Options *local_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RDI;
  uStack_8 = in_RSI;
  MatcherOptions::MatcherOptions((MatcherOptions *)in_stack_fffffffffffffc60);
  local_58 = Options::crfile(local_18);
  local_48 = local_58.ptr_;
  sStack_40 = local_58.len_;
  local_38 = Options::match_crfile(local_18);
  Options::nr_threads(local_18);
  std::
  allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  ::allocator((allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
               *)0x1472a3);
  std::
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  ::vector((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
            *)in_stack_fffffffffffffc80._M_current,(size_type)in_stack_fffffffffffffc78._M_current,
           (allocator_type *)in_stack_fffffffffffffc70);
  std::
  allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  ::~allocator((allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                *)0x1472c9);
  std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::vector
            ((vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> *)0x1472db);
  Options::nr_threads(local_18);
  std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::reserve
            ((vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> *)
             in_stack_fffffffffffffc90._M_current,(size_type)in_stack_fffffffffffffc88._M_current);
  for (local_a4 = 0; uVar1 = local_a4, uVar3 = Options::nr_threads(local_18), uVar1 < uVar3;
      local_a4 = local_a4 + 1) {
    local_d8 = local_a4;
    local_d0 = local_18;
    local_c8 = local_20;
    local_c0 = &local_10;
    local_b8 = &local_48;
    local_b0 = &local_70;
    std::vector<cpsm::Thread,std::allocator<cpsm::Thread>>::
    emplace_back<cpsm::detail::for_each_match<cpsm::NonPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
              ((vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> *)in_stack_fffffffffffffc70,
               (type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
  }
  local_e0 = 0;
  for (local_e4 = 0; uVar1 = local_e4, uVar3 = Options::nr_threads(local_18), uVar1 < uVar3;
      local_e4 = local_e4 + 1) {
    local_f0 = std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::operator[]
                         (local_a0,(ulong)local_e4);
    Thread::join((Thread *)0x14745d);
    bVar2 = Thread::has_exception(local_f0);
    if (bVar2) {
      local_111 = 1;
      this = (Error *)__cxa_allocate_exception(0x28);
      psVar4 = Thread::exception_msg_abi_cxx11_(local_f0);
      std::__cxx11::string::string(local_110,(string *)psVar4);
      Error::Error<std::__cxx11::string>(this,in_stack_fffffffffffffc98);
      local_111 = 0;
      __cxa_throw(this,&Error::typeinfo,Error::~Error);
    }
    this_00 = std::
              vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
              ::operator[](&local_70,(ulong)local_e4);
    sVar5 = std::
            vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
            ::size(this_00);
    local_e0 = sVar5 + local_e0;
  }
  pMVar10 = &local_130;
  std::
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  ::vector((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
            *)0x14758c);
  std::
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  ::reserve((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
             *)in_stack_fffffffffffffc90._M_current,(size_type)in_stack_fffffffffffffc88._M_current)
  ;
  local_138 = &local_70;
  local_140._M_current =
       (vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
        *)std::
          vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
          ::begin((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
                   *)in_stack_fffffffffffffc58);
  std::
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  ::end((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
         *)in_stack_fffffffffffffc58);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_*,_std::vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>_>
                             *)in_stack_fffffffffffffc60,
                            (__normal_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_*,_std::vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>_>
                             *)in_stack_fffffffffffffc58), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_*,_std::vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>_>
    ::operator*(&local_140);
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::begin(in_stack_fffffffffffffc58);
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::end(in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc90._M_current =
         (Matched<cpsm::StringRefItem> *)
         std::
         back_inserter<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>
                   (in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc88._M_current =
         (Matched<cpsm::StringRefItem> *)
         std::
         move<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,std::back_insert_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>>
                   (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                    in_stack_fffffffffffffc78._M_current);
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::shrink_to_fit((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                     *)0x147696);
    __gnu_cxx::
    __normal_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_*,_std::vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>_>
    ::operator++(&local_140);
  }
  sVar6 = Options::limit(local_18);
  if (sVar6 != 0) {
    in_stack_fffffffffffffc80._M_current = (Matched<cpsm::StringRefItem> *)Options::limit(local_18);
    pMVar7 = (Matched<cpsm::StringRefItem> *)
             std::
             vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
             ::size((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                     *)&local_130);
    if (in_stack_fffffffffffffc80._M_current < pMVar7) {
      in_stack_fffffffffffffc78._M_current = &local_130;
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::begin(in_stack_fffffffffffffc58);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::begin(in_stack_fffffffffffffc58);
      Options::limit(local_18);
      __gnu_cxx::
      __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
      ::operator+((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                  (difference_type)in_stack_fffffffffffffc60);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::end(in_stack_fffffffffffffc58);
      std::
      partial_sort<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                 (_func_bool_Matched<cpsm::StringRefItem>_ptr_Matched<cpsm::StringRefItem>_ptr *)
                 in_stack_fffffffffffffc78._M_current);
      Options::limit(local_18);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::resize((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                *)in_stack_fffffffffffffc80._M_current,
               (size_type)in_stack_fffffffffffffc78._M_current);
      goto LAB_00147802;
    }
  }
  in_stack_fffffffffffffc70 = &local_130;
  std::
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  ::begin(in_stack_fffffffffffffc58);
  std::
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  ::end(in_stack_fffffffffffffc58);
  std::
  sort<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (_func_bool_Matched<cpsm::StringRefItem>_ptr_Matched<cpsm::StringRefItem>_ptr *)
             in_stack_fffffffffffffc70);
LAB_00147802:
  bVar2 = Options::want_match_info(local_18);
  if (bVar2) {
    local_2b8 = local_10;
    uStack_2b0 = uStack_8;
    Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::Matcher
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,in_stack_fffffffffffffd68);
    local_2c0 = &local_130;
    local_2c8._M_current =
         (Matched<cpsm::StringRefItem> *)
         std::
         vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
         ::begin(in_stack_fffffffffffffc58);
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::end(in_stack_fffffffffffffc58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                               *)in_stack_fffffffffffffc60,
                              (__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                               *)in_stack_fffffffffffffc58), bVar2) {
      pMVar8 = __gnu_cxx::
               __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
               ::operator*(&local_2c8);
      item_00 = StringRefItem::match_key(&pMVar8->item);
      item.len_ = (size_t)in_stack_fffffffffffffc78._M_current;
      item.ptr_ = (char *)in_stack_fffffffffffffc70;
      in_stack_fffffffffffffc6f =
           Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::match
                     ((Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *)
                      CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),item);
      if (((in_stack_fffffffffffffc6f ^ 0xff) & 1) != 0) {
        uVar9 = __cxa_allocate_exception(0x28);
        StringRefItem::match_key(&pMVar8->item);
        args_1.len_ = in_stack_fffffffffffffca0;
        args_1.ptr_ = (char *)pMVar10;
        Error::Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
                  ((Error *)in_stack_fffffffffffffc90._M_current,
                   (char *)in_stack_fffffffffffffc88._M_current,args_1,
                   (char *)in_stack_fffffffffffffc80._M_current);
        __cxa_throw(uVar9,&Error::typeinfo,Error::~Error);
      }
      local_308 = (pMVar8->item).item_.ptr_;
      sStack_300 = (pMVar8->item).item_.len_;
      main::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffd08._8_8_,(StringRefItem)item_00,
                 in_stack_fffffffffffffd08._0_8_);
      __gnu_cxx::
      __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
      ::operator++(&local_2c8);
    }
    Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::~Matcher(in_stack_fffffffffffffc60);
  }
  else {
    local_310 = &local_130;
    local_318._M_current =
         (Matched<cpsm::StringRefItem> *)
         std::
         vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
         ::begin(in_stack_fffffffffffffc58);
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::end(in_stack_fffffffffffffc58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                               *)in_stack_fffffffffffffc60,
                              (__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                               *)in_stack_fffffffffffffc58), bVar2) {
      __gnu_cxx::
      __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
      ::operator*(&local_318);
      main::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffd08._8_8_,(StringRefItem)in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd08._0_8_);
      __gnu_cxx::
      __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
      ::operator++(&local_318);
    }
  }
  std::
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  ::~vector((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
             *)in_stack_fffffffffffffc70);
  std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::~vector
            ((vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> *)in_stack_fffffffffffffc70);
  std::
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  ::~vector((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
             *)in_stack_fffffffffffffc70);
  return;
}

Assistant:

void for_each_match(boost::string_ref const query, Options const& opts,
                    Source&& src, Sink&& dst) {
  MatcherOptions mopts;
  mopts.crfile = opts.crfile();
  mopts.match_crfile = opts.match_crfile();

  // Match in parallel.
  std::vector<std::vector<Matched<Item>>> thread_matches(opts.nr_threads());
  std::vector<Thread> threads;
  threads.reserve(opts.nr_threads());
  for (unsigned int i = 0; i < opts.nr_threads(); i++) {
    threads.emplace_back([&, i] {
      std::vector<Matched<Item>> matches;
      std::vector<Item> batch;
      // If a limit exists, each thread should only keep that many matches.
      if (opts.limit()) {
        matches.reserve(opts.limit() + 1);
      }
      batch.reserve(src.batch_size());
      Matcher<PathTraits, StringTraits> matcher(query, mopts);
      bool more;
      do {
        // Collect and match a batch.
        more = src.fill(batch);
        for (auto& item : batch) {
          if (matcher.match(item.match_key())) {
            matches.emplace_back(matcher.score(), std::move(item));
            if (opts.limit()) {
              std::push_heap(matches.begin(), matches.end(),
                             Matched<Item>::is_better);
              if (matches.size() > opts.limit()) {
                std::pop_heap(matches.begin(), matches.end(),
                              Matched<Item>::is_better);
                matches.pop_back();
              }
            }
          }
        }
        batch.clear();
      } while (more);
      thread_matches[i] = std::move(matches);
    });
  }

  // Collect matcher threads.
  std::size_t nr_matches = 0;
  for (unsigned int i = 0; i < opts.nr_threads(); i++) {
    auto& thread = threads[i];
    thread.join();
    if (thread.has_exception()) {
      throw Error(thread.exception_msg());
    }
    nr_matches += thread_matches[i].size();
  }

  // Combine per-thread match lists.
  std::vector<Matched<Item>> all_matches;
  all_matches.reserve(nr_matches);
  for (auto& matches : thread_matches) {
    std::move(matches.begin(), matches.end(), std::back_inserter(all_matches));
    matches.shrink_to_fit();
  }

  // Sort and limit matches.
  if (opts.limit() && opts.limit() < all_matches.size()) {
    std::partial_sort(all_matches.begin(), all_matches.begin() + opts.limit(),
                      all_matches.end(), Matched<Item>::is_better);
    all_matches.resize(opts.limit());
  } else {
    std::sort(all_matches.begin(), all_matches.end(), Matched<Item>::is_better);
  }

  // Emit matches.
  if (opts.want_match_info()) {
    Matcher<PathTraits, StringTraits> matcher(query, mopts);
    for (auto& match : all_matches) {
      if (!matcher.match(match.item.match_key())) {
        throw Error("failed to re-match known match '",
                    match.item.match_key(),
                    "' during match position collection");
      }
      dst(match.item, &matcher);
    }
  } else {
    for (auto& match : all_matches) {
      dst(match.item, nullptr);
    }
  }
}